

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_bind.h
# Opt level: O1

void pybind11::detail::
     vector_accessor<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>
               (enable_if_t<_vector_needs_copy<vector<TangleView>_>::value,_pybind11::class_<std::vector<TangleView>,_std::unique_ptr<std::vector<TangleView>_>_>_>
                *cl)

{
  keep_alive<0UL,_1UL> local_c;
  type local_b;
  return_value_policy local_a;
  type local_9;
  
  local_a = reference_internal;
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_accessor<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<_vector_needs_copy<std::vector<TangleView,std::allocator<TangleView>>>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(std::vector<TangleView,std::allocator<TangleView>>&,long)_1_,pybind11::return_value_policy>
            ((class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
              *)cl,"__getitem__",&local_9,&local_a);
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_accessor<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<_vector_needs_copy<std::vector<TangleView,std::allocator<TangleView>>>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(std::vector<TangleView,std::allocator<TangleView>>&)_1_,pybind11::keep_alive<0ul,1ul>>
            ((class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
              *)cl,"__iter__",&local_b,&local_c);
  return;
}

Assistant:

void vector_accessor(enable_if_t<!vector_needs_copy<Vector>::value, Class_> &cl) {
    using T = typename Vector::value_type;
    using SizeType = typename Vector::size_type;
    using DiffType = typename Vector::difference_type;
    using ItType   = typename Vector::iterator;

    auto wrap_i = [](DiffType i, SizeType n) {
        if (i < 0)
            i += n;
        if (i < 0 || (SizeType)i >= n)
            throw index_error();
        return i;
    };

    cl.def("__getitem__",
        [wrap_i](Vector &v, DiffType i) -> T & {
            i = wrap_i(i, v.size());
            return v[(SizeType)i];
        },
        return_value_policy::reference_internal // ref + keepalive
    );

    cl.def("__iter__",
           [](Vector &v) {
               return make_iterator<
                   return_value_policy::reference_internal, ItType, ItType, T&>(
                   v.begin(), v.end());
           },
           keep_alive<0, 1>() /* Essential: keep list alive while iterator exists */
    );
}